

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

void lj_ctype_freestate(global_State *g)

{
  size_t *psVar1;
  CType *pCVar2;
  CTypeID1 *pCVar3;
  size_t sVar4;
  CTState *cts;
  
  cts = (CTState *)(ulong)(g->ctype_state).ptr32;
  if (cts != (CTState *)0x0) {
    lj_ccallback_mcode_free(cts);
    pCVar2 = cts->tab;
    sVar4 = (ulong)cts->sizetab * 0x10;
    (g->gc).total = (g->gc).total - (int)sVar4;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar4;
    (*g->allocf)(g->allocd,pCVar2,sVar4,0);
    pCVar3 = (cts->cb).cbid;
    sVar4 = (ulong)(cts->cb).sizeid * 2;
    (g->gc).total = (g->gc).total - (int)sVar4;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar4;
    (*g->allocf)(g->allocd,pCVar3,sVar4,0);
    (g->gc).total = (g->gc).total - 0x1d0;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + 0x1d0;
    (*g->allocf)(g->allocd,cts,0x1d0,0);
    return;
  }
  return;
}

Assistant:

void lj_ctype_freestate(global_State *g)
{
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    lj_ccallback_mcode_free(cts);
    lj_mem_freevec(g, cts->tab, cts->sizetab, CType);
    lj_mem_freevec(g, cts->cb.cbid, cts->cb.sizeid, CTypeID1);
    lj_mem_freet(g, cts);
  }
}